

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddMouseButtonEvent(ImGuiIO *this,int mouse_button,bool down)

{
  bool local_3a;
  undefined1 local_38 [8];
  ImGuiInputEvent e;
  ImGuiContext *g;
  bool down_local;
  int mouse_button_local;
  ImGuiIO *this_local;
  
  e._16_8_ = GImGui;
  if (&GImGui->IO != this) {
    __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x56b,"void ImGuiIO::AddMouseButtonEvent(int, bool)");
  }
  local_3a = (uint)mouse_button < 5;
  if (local_3a) {
    ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)local_38);
    local_38._0_4_ = ImGuiInputEventType_MouseButton;
    local_38._4_4_ = ImGuiInputSource_Mouse;
    e.Type = mouse_button;
    e.Source._0_1_ = down;
    ImVector<ImGuiInputEvent>::push_back
              ((ImVector<ImGuiInputEvent> *)(e._16_8_ + 0x38e8),(ImGuiInputEvent *)local_38);
    return;
  }
  __assert_fail("mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x56c,"void ImGuiIO::AddMouseButtonEvent(int, bool)");
}

Assistant:

void ImGuiIO::AddMouseButtonEvent(int mouse_button, bool down)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseButton;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseButton.Button = mouse_button;
    e.MouseButton.Down = down;
    g.InputEventsQueue.push_back(e);
}